

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall
QStyleSheetBorderImageData::QStyleSheetBorderImageData(QStyleSheetBorderImageData *this)

{
  int i;
  long lVar1;
  
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  QPixmap::QPixmap(&this->pixmap);
  QImage::QImage(&this->image);
  this->horizStretch = TileMode_Unknown;
  this->vertStretch = TileMode_Unknown;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    this->cuts[lVar1] = -1;
  }
  return;
}

Assistant:

QStyleSheetBorderImageData()
        : horizStretch(QCss::TileMode_Unknown), vertStretch(QCss::TileMode_Unknown)
    {
        for (int i = 0; i < 4; i++)
            cuts[i] = -1;
    }